

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void * unqlite_context_realloc_chunk(unqlite_context *pCtx,void *pChunk,uint nByte)

{
  void *pvVar1;
  long *plVar2;
  ulong uVar3;
  
  pvVar1 = SyMemBackendRealloc(&pCtx->pVm->sAllocator,pChunk,nByte);
  if (pvVar1 != (void *)0x0) {
    uVar3 = (ulong)(pCtx->sChunk).nUsed;
    if (uVar3 != 0) {
      plVar2 = (long *)(pCtx->sChunk).pBase;
      do {
        if ((void *)*plVar2 == pChunk) goto LAB_0010d80c;
        plVar2 = plVar2 + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    plVar2 = (long *)0x0;
LAB_0010d80c:
    if (plVar2 != (long *)0x0) {
      *plVar2 = (long)pvVar1;
    }
  }
  return pvVar1;
}

Assistant:

void * unqlite_context_realloc_chunk(unqlite_context *pCtx,void *pChunk,unsigned int nByte)
{
	return jx9_context_realloc_chunk(pCtx,pChunk,nByte);
}